

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

SingleCallCounter * __thiscall
JsUtil::
List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
RemoveAtEnd(SingleCallCounter *__return_storage_ptr__,
           List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  long lVar5;
  int iVar6;
  SingleCallCounter *pSVar7;
  byte bVar8;
  
  bVar8 = 0;
  iVar6 = (this->super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>)
          .count;
  if (iVar6 < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                       ,0x1d2,"(this->count >= 1)","this->count >= 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    iVar6 = (this->
            super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>).
            count;
  }
  pTVar4 = Item(this,iVar6 + -1);
  pSVar7 = __return_storage_ptr__;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    pSVar7->Function = pTVar4->Function;
    pTVar4 = (Type *)((long)pTVar4 + (ulong)bVar8 * -0x10 + 8);
    pSVar7 = (SingleCallCounter *)((long)pSVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  RemoveAt(this,(this->
                super_ReadOnlyList<TTD::SingleCallCounter,_Memory::HeapAllocator,_DefaultComparer>).
                count + -1);
  return __return_storage_ptr__;
}

Assistant:

T RemoveAtEnd()
        {
            Assert(this->count >= 1);
            T item = this->Item(this->count - 1);
            RemoveAt(this->count - 1);
            return item;
        }